

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageOperands
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info,uint32_t word_index)

{
  Instruction *pIVar1;
  bool bVar2;
  int iVar3;
  ImageOperandsMask IVar4;
  ImageOperandsMask IVar5;
  uint32_t uVar6;
  Op OVar7;
  int32_t iVar8;
  spv_result_t sVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  DiagnosticStream *pDVar10;
  size_t sVar11;
  spv_const_validator_options psVar12;
  spv_const_context psVar13;
  ulong uVar14;
  ImageOperandsMask local_4cd4;
  spv_result_t error_1;
  uint32_t visible_scope;
  DiagnosticStream local_4cc0;
  char *local_4ae8;
  char *local_4ae0;
  char *local_4ad8;
  DiagnosticStream local_4ad0;
  undefined4 local_48f8;
  uint32_t local_48f4;
  spv_result_t error;
  uint32_t available_scope;
  DiagnosticStream local_48e8;
  char *local_4710;
  char *local_4708;
  DiagnosticStream local_4700;
  DiagnosticStream local_4528;
  DiagnosticStream local_4350;
  DiagnosticStream local_4178;
  uint32_t local_3f9c;
  undefined1 local_3f98 [4];
  uint32_t type_id_6;
  DiagnosticStream local_3dc0;
  uint32_t local_3be4;
  undefined1 local_3be0 [4];
  uint32_t type_id_5;
  DiagnosticStream local_3a08;
  DiagnosticStream local_3830;
  DiagnosticStream local_3658;
  uint32_t local_347c;
  undefined1 local_3478 [4];
  uint32_t component_type;
  uint64_t local_32a0;
  uint64_t array_size;
  Instruction *local_30c0;
  Instruction *type_inst;
  uint32_t type_id_4;
  uint32_t id_2;
  DiagnosticStream local_2ed8;
  string local_2d00;
  DiagnosticStream local_2ce0;
  DiagnosticStream local_2b08;
  uint32_t local_2930;
  uint32_t local_292c;
  uint32_t offset_size_1;
  uint32_t plane_size_2;
  uint32_t local_2750;
  uint32_t local_274c;
  uint32_t type_id_3;
  uint32_t id_1;
  DiagnosticStream local_2570;
  uint32_t local_2398;
  uint32_t local_2394;
  uint32_t offset_size;
  uint32_t plane_size_1;
  DiagnosticStream local_21b8;
  uint32_t local_1fe0;
  uint32_t local_1fdc;
  uint32_t type_id_2;
  uint32_t id;
  DiagnosticStream local_1e00;
  DiagnosticStream local_1c28;
  uint32_t local_1a4c;
  uint32_t local_1a48;
  uint32_t dy_size;
  uint32_t dx_size;
  uint32_t plane_size;
  uint32_t local_1868;
  uint32_t local_1864;
  uint32_t dy_type_id;
  uint32_t dx_type_id;
  DiagnosticStream local_1688;
  DiagnosticStream local_14b0;
  DiagnosticStream local_12d8;
  uint32_t local_10fc;
  undefined1 local_10f8 [4];
  uint32_t type_id_1;
  DiagnosticStream local_f20;
  DiagnosticStream local_d48;
  DiagnosticStream local_b70;
  uint32_t local_994;
  undefined1 local_990 [4];
  uint32_t type_id;
  byte local_7b4;
  byte local_7b3;
  byte local_7b2;
  byte local_7b1;
  undefined1 local_7b0 [4];
  bool is_valid_gather_lod_bias_amd;
  bool is_valid_lod_operand;
  bool is_explicit_lod;
  bool is_implicit_lod;
  DiagnosticStream local_5d8;
  DiagnosticStream local_400;
  DiagnosticStream local_228;
  size_t local_50;
  size_t expected_num_image_operand_words;
  ImageOperandsMask local_40;
  uint32_t mask_bits_having_operands;
  uint32_t mask;
  bool have_explicit_mask;
  size_t num_words;
  Op opcode;
  uint32_t word_index_local;
  ImageTypeInfo *info_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  num_words._4_4_ = word_index;
  _opcode = info;
  info_local = (ImageTypeInfo *)inst;
  inst_local = (Instruction *)_;
  if (((anonymous_namespace)::
       ValidateImageOperands(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,spvtools::val::(anonymous_namespace)::ImageTypeInfo_const&,unsigned_int)
       ::kAllImageOperandsHandled == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   ValidateImageOperands(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,spvtools::val::(anonymous_namespace)::ImageTypeInfo_const&,unsigned_int)
                                   ::kAllImageOperandsHandled), iVar3 != 0)) {
    ValidateImageOperands::kAllImageOperandsHandled = CheckAllImageOperandsHandled();
    __cxa_guard_release(&(anonymous_namespace)::
                         ValidateImageOperands(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,spvtools::val::(anonymous_namespace)::ImageTypeInfo_const&,unsigned_int)
                         ::kAllImageOperandsHandled);
  }
  num_words._0_4_ = val::Instruction::opcode((Instruction *)info_local);
  this = val::Instruction::words((Instruction *)info_local);
  _mask = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
  mask_bits_having_operands._3_1_ = num_words._4_4_ - 1 < _mask;
  if ((bool)mask_bits_having_operands._3_1_) {
    local_4cd4 = val::Instruction::word((Instruction *)info_local,(ulong)(num_words._4_4_ - 1));
  }
  else {
    local_4cd4 = ImageOperandsMaskNone;
  }
  local_40 = local_4cd4;
  if ((mask_bits_having_operands._3_1_ & 1) == 0) {
    if (_mask != num_words._4_4_ - 1) {
      ValidationState_t::diag
                (&local_400,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)info_local);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_400,
                           (char (*) [63])
                           "Number of image operand ids doesn\'t correspond to the bit mask");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_400);
      return __local._4_4_;
    }
  }
  else {
    IVar4 = spv::operator|(ImageOperandsNonPrivateTexelKHRMask,ImageOperandsVolatileTexelKHRMask);
    IVar4 = spv::operator|(IVar4,ImageOperandsSignExtendMask);
    IVar4 = spv::operator|(IVar4,ImageOperandsZeroExtendMask);
    IVar4 = spv::operator|(IVar4,ImageOperandsNontemporalMask);
    expected_num_image_operand_words._4_4_ = local_4cd4 & (IVar4 ^ ~ImageOperandsMaskNone);
    local_50 = utils::CountSetBits<unsigned_int>(expected_num_image_operand_words._4_4_);
    if ((local_40 & Grad) != ImageOperandsMaskNone) {
      local_50 = local_50 + 1;
    }
    if (local_50 != _mask - num_words._4_4_) {
      ValidationState_t::diag
                (&local_228,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)info_local);
      pDVar10 = DiagnosticStream::operator<<
                          (&local_228,
                           (char (*) [63])
                           "Number of image operand ids doesn\'t correspond to the bit mask");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
      DiagnosticStream::~DiagnosticStream(&local_228);
      return __local._4_4_;
    }
  }
  IVar4 = local_40;
  if ((_opcode->multisampled & (uint)((local_40 & ImageOperandsSampleMask) == ImageOperandsMaskNone)
      ) == 0) {
    if (local_40 == ImageOperandsMaskNone) {
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      IVar5 = spv::operator|(ImageOperandsOffsetMask,ConstOffset);
      IVar5 = spv::operator|(IVar5,ConstOffsets);
      IVar5 = spv::operator|(IVar5,ImageOperandsOffsetsMask);
      sVar11 = utils::CountSetBits<unsigned_int>(IVar4 & IVar5);
      if (sVar11 < 2) {
        local_7b1 = IsImplicitLod((Op)num_words);
        local_7b2 = IsExplicitLod((Op)num_words);
        local_7b3 = IsValidLodOperand((ValidationState_t *)inst_local,(Op)num_words);
        local_7b4 = IsValidGatherLodBiasAMD((ValidationState_t *)inst_local,(Op)num_words);
        pIVar1 = inst_local;
        if ((local_40 & Bias) != ImageOperandsMaskNone) {
          if (((local_7b1 & 1) == 0) && (!(bool)local_7b4)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_990,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_990,
                                 (char (*) [61])
                                 "Image Operand Bias can only be used with ImplicitLod opcodes");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_990);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          uVar6 = val::Instruction::word((Instruction *)info_local,uVar14);
          local_994 = ValidationState_t::GetTypeId((ValidationState_t *)pIVar1,uVar6);
          bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_994);
          if (!bVar2) {
            ValidationState_t::diag
                      (&local_b70,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_b70,
                                 (char (*) [47])"Expected Image Operand Bias to be float scalar");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_b70);
            return __local._4_4_;
          }
          if ((((_opcode->dim != Dim1D) && (_opcode->dim != Dim2D)) && (_opcode->dim != Dim3D)) &&
             (_opcode->dim != Cube)) {
            ValidationState_t::diag
                      (&local_d48,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_d48,
                                 (char (*) [69])
                                 "Image Operand Bias requires \'Dim\' parameter to be 1D, 2D, 3D or Cube"
                                );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_d48);
            return __local._4_4_;
          }
        }
        pIVar1 = inst_local;
        if ((local_40 & ImageOperandsLodMask) != ImageOperandsMaskNone) {
          if ((((local_7b3 & 1) == 0) && ((Op)num_words != OpImageFetch)) &&
             (((Op)num_words != OpImageSparseFetch && ((local_7b4 & 1) == 0)))) {
            ValidationState_t::diag
                      (&local_f20,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_f20,
                                 (char (*) [61])
                                 "Image Operand Lod can only be used with ExplicitLod opcodes ");
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [17])"and OpImageFetch");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_f20);
            return __local._4_4_;
          }
          if ((local_40 & Grad) != ImageOperandsMaskNone) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_10f8,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_10f8,
                                 (char (*) [63])
                                 "Image Operand bits Lod and Grad cannot be set at the same time");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_10f8);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          uVar6 = val::Instruction::word((Instruction *)info_local,uVar14);
          local_10fc = ValidationState_t::GetTypeId((ValidationState_t *)pIVar1,uVar6);
          if (((local_7b2 & 1) == 0) && ((local_7b4 & 1) == 0)) {
            bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_10fc);
            if (!bVar2) {
              ValidationState_t::diag
                        (&local_14b0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                         (Instruction *)info_local);
              pDVar10 = DiagnosticStream::operator<<
                                  (&local_14b0,
                                   (char (*) [60])
                                   "Expected Image Operand Lod to be int scalar when used with ");
              pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [13])0xf3a37f);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
              DiagnosticStream::~DiagnosticStream(&local_14b0);
              return __local._4_4_;
            }
          }
          else {
            bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_10fc)
            ;
            if (!bVar2) {
              ValidationState_t::diag
                        (&local_12d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                         (Instruction *)info_local);
              pDVar10 = DiagnosticStream::operator<<
                                  (&local_12d8,
                                   (char (*) [57])
                                   "Expected Image Operand Lod to be float scalar when used ");
              pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [17])"with ExplicitLod");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
              DiagnosticStream::~DiagnosticStream(&local_12d8);
              return __local._4_4_;
            }
          }
          if ((((_opcode->dim != Dim1D) && (_opcode->dim != Dim2D)) && (_opcode->dim != Dim3D)) &&
             (_opcode->dim != Cube)) {
            ValidationState_t::diag
                      (&local_1688,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_1688,
                                 (char (*) [68])
                                 "Image Operand Lod requires \'Dim\' parameter to be 1D, 2D, 3D or Cube"
                                );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_1688);
            return __local._4_4_;
          }
        }
        pIVar1 = inst_local;
        if ((local_40 & Grad) != ImageOperandsMaskNone) {
          if ((local_7b2 & 1) == 0) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&dy_type_id,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&dy_type_id,
                                 (char (*) [61])
                                 "Image Operand Grad can only be used with ExplicitLod opcodes");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&dy_type_id);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          uVar6 = val::Instruction::word((Instruction *)info_local,uVar14);
          local_1864 = ValidationState_t::GetTypeId((ValidationState_t *)pIVar1,uVar6);
          pIVar1 = inst_local;
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          uVar6 = val::Instruction::word((Instruction *)info_local,uVar14);
          local_1868 = ValidationState_t::GetTypeId((ValidationState_t *)pIVar1,uVar6);
          bVar2 = ValidationState_t::IsFloatScalarOrVectorType
                            ((ValidationState_t *)inst_local,local_1864);
          if ((!bVar2) ||
             (bVar2 = ValidationState_t::IsFloatScalarOrVectorType
                                ((ValidationState_t *)inst_local,local_1868), !bVar2)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&dx_size,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&dx_size,
                                 (char (*) [61])
                                 "Expected both Image Operand Grad ids to be float scalars or ");
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [8])0xf35987);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&dx_size);
            return __local._4_4_;
          }
          dy_size = GetPlaneCoordSize(_opcode);
          local_1a48 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_1864);
          local_1a4c = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_1868);
          if (dy_size != local_1a48) {
            ValidationState_t::diag
                      (&local_1c28,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_1c28,
                                 (char (*) [40])"Expected Image Operand Grad dx to have ");
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&dy_size);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [24])" components, but given ")
            ;
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_1a48);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_1c28);
            return __local._4_4_;
          }
          if (dy_size != local_1a4c) {
            ValidationState_t::diag
                      (&local_1e00,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_1e00,
                                 (char (*) [40])"Expected Image Operand Grad dy to have ");
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&dy_size);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [24])" components, but given ")
            ;
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_1a4c);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_1e00);
            return __local._4_4_;
          }
        }
        if ((local_40 & ConstOffset) != ImageOperandsMaskNone) {
          if (_opcode->dim == Cube) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&type_id_2,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&type_id_2,
                                 (char (*) [63])
                                 "Image Operand ConstOffset cannot be used with Cube Image \'Dim\'")
            ;
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&type_id_2);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          local_1fdc = val::Instruction::word((Instruction *)info_local,uVar14);
          local_1fe0 = ValidationState_t::GetTypeId((ValidationState_t *)inst_local,local_1fdc);
          bVar2 = ValidationState_t::IsIntScalarOrVectorType
                            ((ValidationState_t *)inst_local,local_1fe0);
          if (!bVar2) {
            ValidationState_t::diag
                      (&local_21b8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_21b8,
                                 (char (*) [56])
                                 "Expected Image Operand ConstOffset to be int scalar or ");
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [7])0xef3c12);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_21b8);
            return __local._4_4_;
          }
          OVar7 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_1fdc);
          iVar8 = spvOpcodeIsConstant(OVar7);
          if (iVar8 == 0) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&offset_size,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&offset_size,
                                 (char (*) [56])
                                 "Expected Image Operand ConstOffset to be a const object");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&offset_size);
            return __local._4_4_;
          }
          local_2394 = GetPlaneCoordSize(_opcode);
          local_2398 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_1fe0);
          if (local_2394 != local_2398) {
            ValidationState_t::diag
                      (&local_2570,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_2570,
                                 (char (*) [44])"Expected Image Operand ConstOffset to have ");
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_2394);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [24])" components, but given ")
            ;
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_2398);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_2570);
            return __local._4_4_;
          }
        }
        if ((local_40 & ImageOperandsOffsetMask) != ImageOperandsMaskNone) {
          if (_opcode->dim == Cube) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&type_id_3,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&type_id_3,
                                 (char (*) [58])
                                 "Image Operand Offset cannot be used with Cube Image \'Dim\'");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&type_id_3);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          local_274c = val::Instruction::word((Instruction *)info_local,uVar14);
          local_2750 = ValidationState_t::GetTypeId((ValidationState_t *)inst_local,local_274c);
          bVar2 = ValidationState_t::IsIntScalarOrVectorType
                            ((ValidationState_t *)inst_local,local_2750);
          if (!bVar2) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&offset_size_1,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&offset_size_1,
                                 (char (*) [51])"Expected Image Operand Offset to be int scalar or "
                                );
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [7])0xef3c12);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&offset_size_1);
            return __local._4_4_;
          }
          local_292c = GetPlaneCoordSize(_opcode);
          local_2930 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_2750);
          if (local_292c != local_2930) {
            ValidationState_t::diag
                      (&local_2b08,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_2b08,(char (*) [39])"Expected Image Operand Offset to have "
                                );
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_292c);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [24])" components, but given ")
            ;
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_2930);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_2b08);
            return __local._4_4_;
          }
          psVar12 = ValidationState_t::options((ValidationState_t *)inst_local);
          if ((psVar12->before_hlsl_legalization & 1U) == 0) {
            psVar13 = ValidationState_t::context((ValidationState_t *)inst_local);
            bVar2 = spvIsVulkanEnv(psVar13->target_env);
            if (((bVar2) &&
                (psVar12 = ValidationState_t::options((ValidationState_t *)inst_local),
                (psVar12->allow_offset_texture_operand & 1U) == 0)) &&
               (((Op)num_words != OpImageGather &&
                ((((Op)num_words != OpImageDrefGather && ((Op)num_words != OpImageSparseGather)) &&
                 ((Op)num_words != OpImageSparseDrefGather)))))) {
              ValidationState_t::diag
                        (&local_2ce0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                         (Instruction *)info_local);
              ValidationState_t::VkErrorID_abi_cxx11_
                        (&local_2d00,(ValidationState_t *)inst_local,0x27e5,(char *)0x0);
              pDVar10 = DiagnosticStream::operator<<(&local_2ce0,&local_2d00);
              pDVar10 = DiagnosticStream::operator<<
                                  (pDVar10,(char (*) [69])
                                           "Image Operand Offset can only be used with OpImage*Gather operations"
                                  );
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
              std::__cxx11::string::~string((string *)&local_2d00);
              DiagnosticStream::~DiagnosticStream(&local_2ce0);
              return __local._4_4_;
            }
          }
        }
        if ((local_40 & ConstOffsets) != ImageOperandsMaskNone) {
          if ((((Op)num_words != OpImageGather) && ((Op)num_words != OpImageDrefGather)) &&
             (((Op)num_words != OpImageSparseGather && ((Op)num_words != OpImageSparseDrefGather))))
          {
            ValidationState_t::diag
                      (&local_2ed8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_2ed8,
                                 (char (*) [85])
                                 "Image Operand ConstOffsets can only be used with OpImageGather and OpImageDrefGather"
                                );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_2ed8);
            return __local._4_4_;
          }
          if (_opcode->dim == Cube) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&type_id_4,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&type_id_4,
                                 (char (*) [64])
                                 "Image Operand ConstOffsets cannot be used with Cube Image \'Dim\'"
                                );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&type_id_4);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          type_inst._4_4_ = val::Instruction::word((Instruction *)info_local,uVar14);
          type_inst._0_4_ =
               ValidationState_t::GetTypeId((ValidationState_t *)inst_local,type_inst._4_4_);
          local_30c0 = ValidationState_t::FindDef
                                 ((ValidationState_t *)inst_local,(uint32_t)type_inst);
          if (local_30c0 == (Instruction *)0x0) {
            __assert_fail("type_inst",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                          ,0x1eb,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageOperands(ValidationState_t &, const Instruction *, const ImageTypeInfo &, uint32_t)"
                         );
          }
          OVar7 = val::Instruction::opcode(local_30c0);
          pIVar1 = inst_local;
          if (OVar7 != OpTypeArray) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&array_size,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&array_size,
                                 (char (*) [61])
                                 "Expected Image Operand ConstOffsets to be an array of size 4");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&array_size);
            return __local._4_4_;
          }
          local_32a0 = 0;
          uVar6 = val::Instruction::word(local_30c0,3);
          bVar2 = ValidationState_t::EvalConstantValUint64
                            ((ValidationState_t *)pIVar1,uVar6,&local_32a0);
          if (!bVar2) {
            __assert_fail("0 && \"Array type definition is corrupt\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                          ,500,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageOperands(ValidationState_t &, const Instruction *, const ImageTypeInfo &, uint32_t)"
                         );
          }
          if (local_32a0 != 4) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_3478,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_3478,
                                 (char (*) [61])
                                 "Expected Image Operand ConstOffsets to be an array of size 4");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3478);
            return __local._4_4_;
          }
          local_347c = val::Instruction::word(local_30c0,2);
          bVar2 = ValidationState_t::IsIntVectorType((ValidationState_t *)inst_local,local_347c);
          if ((!bVar2) ||
             (uVar6 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_347c),
             uVar6 != 2)) {
            ValidationState_t::diag
                      (&local_3658,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_3658,
                                 (char (*) [81])
                                 "Expected Image Operand ConstOffsets array components to be int vectors of size 2"
                                );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_3658);
            return __local._4_4_;
          }
          OVar7 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,type_inst._4_4_);
          iVar8 = spvOpcodeIsConstant(OVar7);
          if (iVar8 == 0) {
            ValidationState_t::diag
                      (&local_3830,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_3830,
                                 (char (*) [57])
                                 "Expected Image Operand ConstOffsets to be a const object");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_3830);
            return __local._4_4_;
          }
        }
        pIVar1 = inst_local;
        if ((local_40 & ImageOperandsSampleMask) != ImageOperandsMaskNone) {
          if (((((Op)num_words != OpImageFetch) && ((Op)num_words != OpImageRead)) &&
              ((Op)num_words != OpImageWrite)) &&
             (((Op)num_words != OpImageSparseFetch && ((Op)num_words != OpImageSparseRead)))) {
            ValidationState_t::diag
                      (&local_3a08,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_3a08,
                                 (char (*) [58])
                                 "Image Operand Sample can only be used with OpImageFetch, ");
            pDVar10 = DiagnosticStream::operator<<
                                (pDVar10,(char (*) [51])
                                         "OpImageRead, OpImageWrite, OpImageSparseFetch and ");
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [18])"OpImageSparseRead");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_3a08);
            return __local._4_4_;
          }
          if (_opcode->multisampled == 0) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_3be0,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_3be0,
                                 (char (*) [54])
                                 "Image Operand Sample requires non-zero \'MS\' parameter");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3be0);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          uVar6 = val::Instruction::word((Instruction *)info_local,uVar14);
          local_3be4 = ValidationState_t::GetTypeId((ValidationState_t *)pIVar1,uVar6);
          bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_3be4);
          if (!bVar2) {
            ValidationState_t::diag
                      (&local_3dc0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_3dc0,
                                 (char (*) [47])"Expected Image Operand Sample to be int scalar");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_3dc0);
            return __local._4_4_;
          }
        }
        pIVar1 = inst_local;
        if ((local_40 & ImageOperandsMinLodMask) != ImageOperandsMaskNone) {
          if (((local_7b1 & 1) == 0) && ((local_40 & Grad) == ImageOperandsMaskNone)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_3f98,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_3f98,
                                 (char (*) [56])
                                 "Image Operand MinLod can only be used with ImplicitLod ");
            pDVar10 = DiagnosticStream::operator<<
                                (pDVar10,(char (*) [44])
                                         "opcodes or together with Image Operand Grad");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f98);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          uVar6 = val::Instruction::word((Instruction *)info_local,uVar14);
          local_3f9c = ValidationState_t::GetTypeId((ValidationState_t *)pIVar1,uVar6);
          bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_3f9c);
          if (!bVar2) {
            ValidationState_t::diag
                      (&local_4178,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_4178,
                                 (char (*) [49])"Expected Image Operand MinLod to be float scalar");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_4178);
            return __local._4_4_;
          }
          if ((((_opcode->dim != Dim1D) && (_opcode->dim != Dim2D)) && (_opcode->dim != Dim3D)) &&
             (_opcode->dim != Cube)) {
            ValidationState_t::diag
                      (&local_4350,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_4350,
                                 (char (*) [71])
                                 "Image Operand MinLod requires \'Dim\' parameter to be 1D, 2D, 3D or Cube"
                                );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_4350);
            return __local._4_4_;
          }
          if (_opcode->multisampled != 0) {
            ValidationState_t::diag
                      (&local_4528,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_4528,
                                 (char (*) [53])
                                 "Image Operand MinLod requires \'MS\' parameter to be 0");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_4528);
            return __local._4_4_;
          }
        }
        if ((local_40 & ImageOperandsMakeTexelAvailableKHRMask) != ImageOperandsMaskNone) {
          if ((Op)num_words != OpImageWrite) {
            ValidationState_t::diag
                      (&local_4700,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_4700,
                                 (char (*) [61])
                                 "Image Operand MakeTexelAvailableKHR can only be used with Op");
            local_4708 = spvOpcodeString(OpImageWrite);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_4708);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [5])0xf3ab86);
            local_4710 = spvOpcodeString((Op)num_words);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_4710);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_4700);
            return __local._4_4_;
          }
          if ((local_40 & ImageOperandsNonPrivateTexelKHRMask) == ImageOperandsMaskNone) {
            ValidationState_t::diag
                      (&local_48e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_48e8,
                                 (char (*) [86])
                                 "Image Operand MakeTexelAvailableKHR requires NonPrivateTexelKHR is also specified: Op"
                                );
            _error = spvOpcodeString((Op)num_words);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char **)&error);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_48e8);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          local_48f4 = val::Instruction::word((Instruction *)info_local,uVar14);
          sVar9 = ValidateMemoryScope((ValidationState_t *)inst_local,(Instruction *)info_local,
                                      local_48f4);
          if (sVar9 != SPV_SUCCESS) {
            return sVar9;
          }
          local_48f8 = 0;
        }
        if ((local_40 & ImageOperandsMakeTexelVisibleKHRMask) != ImageOperandsMaskNone) {
          if (((Op)num_words != OpImageRead) && ((Op)num_words != OpImageSparseRead)) {
            ValidationState_t::diag
                      (&local_4ad0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_4ad0,
                                 (char (*) [59])
                                 "Image Operand MakeTexelVisibleKHR can only be used with Op");
            local_4ad8 = spvOpcodeString(OpImageRead);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_4ad8);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [7])" or Op");
            local_4ae0 = spvOpcodeString(OpImageSparseRead);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_4ae0);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char (*) [5])0xf3ab86);
            local_4ae8 = spvOpcodeString((Op)num_words);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,&local_4ae8);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_4ad0);
            return __local._4_4_;
          }
          if ((local_40 & ImageOperandsNonPrivateTexelKHRMask) == ImageOperandsMaskNone) {
            ValidationState_t::diag
                      (&local_4cc0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)info_local);
            pDVar10 = DiagnosticStream::operator<<
                                (&local_4cc0,
                                 (char (*) [84])
                                 "Image Operand MakeTexelVisibleKHR requires NonPrivateTexelKHR is also specified: Op"
                                );
            _error_1 = spvOpcodeString((Op)num_words);
            pDVar10 = DiagnosticStream::operator<<(pDVar10,(char **)&error_1);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
            DiagnosticStream::~DiagnosticStream(&local_4cc0);
            return __local._4_4_;
          }
          uVar14 = (ulong)num_words._4_4_;
          num_words._4_4_ = num_words._4_4_ + 1;
          uVar6 = val::Instruction::word((Instruction *)info_local,uVar14);
          sVar9 = ValidateMemoryScope((ValidationState_t *)inst_local,(Instruction *)info_local,
                                      uVar6);
          if (sVar9 != SPV_SUCCESS) {
            return sVar9;
          }
        }
        __local._4_4_ = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_7b0,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,(Instruction *)info_local);
        pDVar10 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)local_7b0,
                             (char (*) [82])
                             "Image Operands Offset, ConstOffset, ConstOffsets, Offsets cannot be used together"
                            );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_7b0);
      }
    }
  }
  else {
    ValidationState_t::diag
              (&local_5d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               (Instruction *)info_local);
    pDVar10 = DiagnosticStream::operator<<
                        (&local_5d8,
                         (char (*) [70])
                         "Image Operand Sample is required for operation on multi-sampled image");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar10);
    DiagnosticStream::~DiagnosticStream(&local_5d8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateImageOperands(ValidationState_t& _,
                                   const Instruction* inst,
                                   const ImageTypeInfo& info,
                                   uint32_t word_index) {
  static const bool kAllImageOperandsHandled = CheckAllImageOperandsHandled();
  (void)kAllImageOperandsHandled;

  const spv::Op opcode = inst->opcode();
  const size_t num_words = inst->words().size();

  const bool have_explicit_mask = (word_index - 1 < num_words);
  const uint32_t mask = have_explicit_mask ? inst->word(word_index - 1) : 0u;

  if (have_explicit_mask) {
    // NonPrivate, Volatile, SignExtend, ZeroExtend take no operand words.
    const uint32_t mask_bits_having_operands =
        mask & ~uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR |
                         spv::ImageOperandsMask::VolatileTexelKHR |
                         spv::ImageOperandsMask::SignExtend |
                         spv::ImageOperandsMask::ZeroExtend |
                         spv::ImageOperandsMask::Nontemporal);
    size_t expected_num_image_operand_words =
        spvtools::utils::CountSetBits(mask_bits_having_operands);
    if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
      // Grad uses two words.
      ++expected_num_image_operand_words;
    }

    if (expected_num_image_operand_words != num_words - word_index) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Number of image operand ids doesn't correspond to the bit "
                "mask";
    }
  } else if (num_words != word_index - 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Number of image operand ids doesn't correspond to the bit mask";
  }

  if (info.multisampled &
      (0 == (mask & uint32_t(spv::ImageOperandsMask::Sample)))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image Operand Sample is required for operation on "
              "multi-sampled image";
  }

  // After this point, only set bits in the image operands mask can cause
  // the module to be invalid.
  if (mask == 0) return SPV_SUCCESS;

  if (spvtools::utils::CountSetBits(
          mask & uint32_t(spv::ImageOperandsMask::Offset |
                          spv::ImageOperandsMask::ConstOffset |
                          spv::ImageOperandsMask::ConstOffsets |
                          spv::ImageOperandsMask::Offsets)) > 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image Operands Offset, ConstOffset, ConstOffsets, Offsets "
              "cannot be used together";
  }

  const bool is_implicit_lod = IsImplicitLod(opcode);
  const bool is_explicit_lod = IsExplicitLod(opcode);
  const bool is_valid_lod_operand = IsValidLodOperand(_, opcode);
  const bool is_valid_gather_lod_bias_amd = IsValidGatherLodBiasAMD(_, opcode);

  // The checks should be done in the order of definition of OperandImage.

  if (mask & uint32_t(spv::ImageOperandsMask::Bias)) {
    if (!is_implicit_lod && !is_valid_gather_lod_bias_amd) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Bias can only be used with ImplicitLod opcodes";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Bias to be float scalar";
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Bias requires 'Dim' parameter to be 1D, 2D, 3D "
                "or Cube";
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Lod)) {
    if (!is_valid_lod_operand && opcode != spv::Op::OpImageFetch &&
        opcode != spv::Op::OpImageSparseFetch &&
        !is_valid_gather_lod_bias_amd) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Lod can only be used with ExplicitLod opcodes "
             << "and OpImageFetch";
    }

    if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand bits Lod and Grad cannot be set at the same "
                "time";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (is_explicit_lod || is_valid_gather_lod_bias_amd) {
      if (!_.IsFloatScalarType(type_id)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Image Operand Lod to be float scalar when used "
               << "with ExplicitLod";
      }
    } else {
      if (!_.IsIntScalarType(type_id)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Image Operand Lod to be int scalar when used with "
               << "OpImageFetch";
      }
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Lod requires 'Dim' parameter to be 1D, 2D, 3D "
                "or Cube";
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
    if (!is_explicit_lod) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Grad can only be used with ExplicitLod opcodes";
    }

    const uint32_t dx_type_id = _.GetTypeId(inst->word(word_index++));
    const uint32_t dy_type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarOrVectorType(dx_type_id) ||
        !_.IsFloatScalarOrVectorType(dy_type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected both Image Operand Grad ids to be float scalars or "
             << "vectors";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t dx_size = _.GetDimension(dx_type_id);
    const uint32_t dy_size = _.GetDimension(dy_type_id);
    if (plane_size != dx_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Grad dx to have " << plane_size
             << " components, but given " << dx_size;
    }

    if (plane_size != dy_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Grad dy to have " << plane_size
             << " components, but given " << dy_size;
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ConstOffset)) {
    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffset cannot be used with Cube Image "
                "'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    if (!_.IsIntScalarOrVectorType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to be int scalar or "
             << "vector";
    }

    if (!spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to be a const object";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t offset_size = _.GetDimension(type_id);
    if (plane_size != offset_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to have " << plane_size
             << " components, but given " << offset_size;
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Offset)) {
    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Offset cannot be used with Cube Image 'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    if (!_.IsIntScalarOrVectorType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Offset to be int scalar or "
             << "vector";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t offset_size = _.GetDimension(type_id);
    if (plane_size != offset_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Offset to have " << plane_size
             << " components, but given " << offset_size;
    }

    if (!_.options()->before_hlsl_legalization &&
        spvIsVulkanEnv(_.context()->target_env) &&
        !_.options()->allow_offset_texture_operand) {
      if (opcode != spv::Op::OpImageGather &&
          opcode != spv::Op::OpImageDrefGather &&
          opcode != spv::Op::OpImageSparseGather &&
          opcode != spv::Op::OpImageSparseDrefGather) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(10213)
               << "Image Operand Offset can only be used with "
                  "OpImage*Gather operations";
      }
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ConstOffsets)) {
    if (opcode != spv::Op::OpImageGather &&
        opcode != spv::Op::OpImageDrefGather &&
        opcode != spv::Op::OpImageSparseGather &&
        opcode != spv::Op::OpImageSparseDrefGather) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffsets can only be used with "
                "OpImageGather and OpImageDrefGather";
    }

    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffsets cannot be used with Cube Image "
                "'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    const Instruction* type_inst = _.FindDef(type_id);
    assert(type_inst);

    if (type_inst->opcode() != spv::Op::OpTypeArray) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be an array of size 4";
    }

    uint64_t array_size = 0;
    if (!_.EvalConstantValUint64(type_inst->word(3), &array_size)) {
      assert(0 && "Array type definition is corrupt");
    }

    if (array_size != 4) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be an array of size 4";
    }

    const uint32_t component_type = type_inst->word(2);
    if (!_.IsIntVectorType(component_type) ||
        _.GetDimension(component_type) != 2) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets array components to be "
                "int vectors of size 2";
    }

    if (!spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be a const object";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Sample)) {
    if (opcode != spv::Op::OpImageFetch && opcode != spv::Op::OpImageRead &&
        opcode != spv::Op::OpImageWrite &&
        opcode != spv::Op::OpImageSparseFetch &&
        opcode != spv::Op::OpImageSparseRead) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Sample can only be used with OpImageFetch, "
             << "OpImageRead, OpImageWrite, OpImageSparseFetch and "
             << "OpImageSparseRead";
    }

    if (info.multisampled == 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Sample requires non-zero 'MS' parameter";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsIntScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Sample to be int scalar";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MinLod)) {
    if (!is_implicit_lod && !(mask & uint32_t(spv::ImageOperandsMask::Grad))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod can only be used with ImplicitLod "
             << "opcodes or together with Image Operand Grad";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand MinLod to be float scalar";
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod requires 'Dim' parameter to be 1D, 2D, "
                "3D or Cube";
    }

    if (info.multisampled != 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod requires 'MS' parameter to be 0";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MakeTexelAvailableKHR)) {
    // Checked elsewhere: capability and memory model are correct.
    if (opcode != spv::Op::OpImageWrite) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelAvailableKHR can only be used with Op"
             << spvOpcodeString(spv::Op::OpImageWrite) << ": Op"
             << spvOpcodeString(opcode);
    }

    if (!(mask & uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelAvailableKHR requires "
                "NonPrivateTexelKHR is also specified: Op"
             << spvOpcodeString(opcode);
    }

    const auto available_scope = inst->word(word_index++);
    if (auto error = ValidateMemoryScope(_, inst, available_scope))
      return error;
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MakeTexelVisibleKHR)) {
    // Checked elsewhere: capability and memory model are correct.
    if (opcode != spv::Op::OpImageRead &&
        opcode != spv::Op::OpImageSparseRead) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelVisibleKHR can only be used with Op"
             << spvOpcodeString(spv::Op::OpImageRead) << " or Op"
             << spvOpcodeString(spv::Op::OpImageSparseRead) << ": Op"
             << spvOpcodeString(opcode);
    }

    if (!(mask & uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelVisibleKHR requires NonPrivateTexelKHR "
                "is also specified: Op"
             << spvOpcodeString(opcode);
    }

    const auto visible_scope = inst->word(word_index++);
    if (auto error = ValidateMemoryScope(_, inst, visible_scope)) return error;
  }

  if (mask & uint32_t(spv::ImageOperandsMask::SignExtend)) {
    // Checked elsewhere: SPIR-V 1.4 version or later.

    // "The texel value is converted to the target value via sign extension.
    // Only valid when the texel type is a scalar or vector of integer type."
    //
    // We don't have enough information to know what the texel type is.
    // In OpenCL, knowledge is deferred until runtime: the image SampledType is
    // void, and the Format is Unknown.
    // In Vulkan, the texel type is only known in all cases by the pipeline
    // setup.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ZeroExtend)) {
    // Checked elsewhere: SPIR-V 1.4 version or later.

    // "The texel value is converted to the target value via zero extension.
    // Only valid when the texel type is a scalar or vector of integer type."
    //
    // We don't have enough information to know what the texel type is.
    // In OpenCL, knowledge is deferred until runtime: the image SampledType is
    // void, and the Format is Unknown.
    // In Vulkan, the texel type is only known in all cases by the pipeline
    // setup.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Offsets)) {
    // TODO: add validation
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Nontemporal)) {
    // Checked elsewhere: SPIR-V 1.6 version or later.
  }

  return SPV_SUCCESS;
}